

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni.h
# Opt level: O2

wchar_t __thiscall CVmCaseFoldStr::getch(CVmCaseFoldStr *this)

{
  wchar_t *pwVar1;
  wchar_t ch;
  wchar_t *pwVar2;
  
  pwVar2 = this->fp;
  pwVar1 = this->ie;
  if ((pwVar2 != pwVar1) && (*pwVar2 == L'\0')) {
    if (this->rem == 0) {
      return L'\0';
    }
    pwVar2 = this->p;
    this->p = pwVar2 + 1;
    ch = *pwVar2;
    this->rem = this->rem - 1;
    pwVar2 = t3_to_fold(ch);
    if (pwVar2 == (wchar_t *)0x0) {
      this->ie[0] = ch;
      this->fpbase = pwVar1;
      pwVar2 = pwVar1;
    }
  }
  this->fp = pwVar2 + 1;
  return *pwVar2;
}

Assistant:

wchar_t getch()
    {
        /* if the expansion is exhausted, expand the next source character */
        if (fp != ie && *fp == 0)
        {
            /* if there's nothing left in the source string, we're done */
            if (rem == 0)
                return 0;

            /* get the next source character */
            wchar_t ch = *p++;
            --rem;

            /* get its case-folded expansion */
            if ((fp = t3_to_fold(ch)) == 0)
            {
                ie[0] = ch;
                fpbase = fp = ie;
            }
        }

        /* return the next expansion character */
        return *fp++;
    }